

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<18,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  MatrixCaseUtils local_104 [12];
  Type in1;
  Type in0;
  VecAccess<float,_4,_3> local_78;
  Matrix<float,_4,_4> local_60;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,13>(&in0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&in0,(float *)s_constInMat4x4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,13>(&in1,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x1,in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&in1,(float *)(s_constInMat4x4 + 0x40));
  }
  tcu::operator/(&local_60,&in0,&in1);
  reduceToVec3(local_104,&local_60);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_104);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}